

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  size_type sVar4;
  pointer pcVar5;
  long lVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pp_Var2 = out->_vptr_basic_ostream;
  lVar6 = (long)(int)wid;
  *(long *)(&out->field_0x10 + (long)pp_Var2[-3]) = lVar6;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&out->field_0x18 + (long)p_Var3) =
       *(uint *)(&out->field_0x18 + (long)p_Var3) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,(name->_M_dataplus)._M_p,name->_M_string_length);
  if (description->_M_string_length != 0) {
    if (wid <= name->_M_string_length) {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      *(long *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = lVar6;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"",0);
    }
    sVar4 = description->_M_string_length;
    if (sVar4 != 0) {
      pcVar5 = (description->_M_dataplus)._M_p;
      sVar7 = 0;
      do {
        cVar1 = pcVar5[sVar7];
        ::std::ostream::put((char)out);
        if (cVar1 == '\n') {
          *(long *)(&out->field_0x10 + (long)out->_vptr_basic_ostream[-3]) = lVar6;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"",0);
        }
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  return out;
}

Assistant:

inline std::ostream &format_help(std::ostream &out, std::string name, const std::string &description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}